

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,double f)

{
  RealNumberNotation RVar1;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> QVar2;
  QTextStreamPrivate *this_00;
  uint uVar3;
  bool bVar4;
  NumberOptions NVar5;
  QLocalePrivate *pQVar6;
  uint uVar7;
  DoubleForm form;
  QTextStream *pQVar8;
  QTextStreamPrivate *d;
  long in_FS_OFFSET;
  QLocale local_60;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t
            .super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
            super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    local_58.context.version = 2;
    local_58.context.function._4_4_ = 0;
    local_58.context.line = 0;
    local_58.context.file._0_4_ = 0;
    local_58.context.file._4_4_ = 0;
    local_58.context.function._0_4_ = 0;
    local_58.context.category = "default";
    QMessageLogger::warning(&local_58,"QTextStream: No device");
  }
  else {
    RVar1 = (this_00->params).realNumberNotation;
    form = DFSignificantDigits;
    if (RVar1 != SmartNotation) {
      form = (uint)(RVar1 != ScientificNotation);
    }
    locale((QTextStream *)&local_58);
    NVar5 = QLocale::numberOptions((QLocale *)&local_58);
    QLocale::~QLocale((QLocale *)&local_58);
    QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (((this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl)->params).numberFlags.
         super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
         super_QFlagsStorage<QTextStream::NumberFlag>;
    pQVar8 = this;
    locale((QTextStream *)&local_58);
    QLocale::c(&local_60,pQVar8);
    uVar7 = (int)QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i * 4 & 0x40U |
            ((uint)QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i & 8) << 5 |
            (int)QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i * 4 & 0x10U |
            ((uint)QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i & 1) << 7;
    uVar3 = uVar7 | 0x481;
    if (((uint)QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i & 2) == 0) {
      uVar3 = uVar7;
    }
    bVar4 = ::operator!=((QLocale *)&local_58,&local_60);
    QLocale::~QLocale(&local_60);
    QLocale::~QLocale((QLocale *)&local_58);
    uVar7 = (((uint)NVar5.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                    super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5 | uVar3) ^ 0x20;
    if (!bVar4) {
      uVar7 = uVar3;
    }
    pQVar6 = QSharedDataPointer<QLocalePrivate>::operator->(&(this_00->locale).d);
    local_58.context.function._0_4_ = 0xaaaaaaaa;
    local_58.context.function._4_4_ = 0xaaaaaaaa;
    local_58.context.version = -0x55555556;
    local_58.context.line = -0x55555556;
    local_58.context.file._0_4_ = 0xaaaaaaaa;
    local_58.context.file._4_4_ = 0xaaaaaaaa;
    QLocaleData::doubleToString
              ((QString *)&local_58,pQVar6->m_data,f,(this_00->params).realNumberPrecision,form,-1,
               ((uint)NVar5.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                      super_QFlagsStorage<QLocale::NumberOption>.i >> 4 & 1 |
               ((uint)NVar5.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                      super_QFlagsStorage<QLocale::NumberOption>.i & 4) << 7) ^ 0x200 | uVar7);
    QTextStreamPrivate::putString
              (this_00,(QChar *)CONCAT44(local_58.context.file._4_4_,local_58.context.file._0_4_),
               CONCAT44(local_58.context.function._4_4_,local_58.context.function._0_4_),true);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(double f)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);

    QLocaleData::DoubleForm form = QLocaleData::DFDecimal;
    switch (realNumberNotation()) {
    case FixedNotation:
        form = QLocaleData::DFDecimal;
        break;
    case ScientificNotation:
        form = QLocaleData::DFExponent;
        break;
    case SmartNotation:
        form = QLocaleData::DFSignificantDigits;
        break;
    }

    uint flags = 0;
    const QLocale::NumberOptions numberOptions = locale().numberOptions();
    if (numberFlags() & ShowBase)
        flags |= QLocaleData::ShowBase;
    if (numberFlags() & ForceSign)
        flags |= QLocaleData::AlwaysShowSign;
    if (numberFlags() & UppercaseBase)
        flags |= QLocaleData::UppercaseBase;
    if (numberFlags() & UppercaseDigits)
        flags |= QLocaleData::CapitalEorX;
    if (numberFlags() & ForcePoint) {
        flags |= QLocaleData::ForcePoint;

        // Only for backwards compatibility
        flags |= QLocaleData::AddTrailingZeroes | QLocaleData::ShowBase;
    }
    if (locale() != QLocale::c() && !(numberOptions & QLocale::OmitGroupSeparator))
        flags |= QLocaleData::GroupDigits;
    if (!(numberOptions & QLocale::OmitLeadingZeroInExponent))
        flags |= QLocaleData::ZeroPadExponent;
    if (numberOptions & QLocale::IncludeTrailingZeroesAfterDot)
        flags |= QLocaleData::AddTrailingZeroes;

    const QLocaleData *dd = d->locale.d->m_data;
    QString num = dd->doubleToString(f, d->params.realNumberPrecision, form, -1, flags);
    d->putString(num, true);
    return *this;
}